

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMultiProcessHandler.cxx
# Opt level: O2

void __thiscall
cmCTestMultiProcessHandler::SetParallelLevel
          (cmCTestMultiProcessHandler *this,optional<unsigned_long> level)

{
  bool bVar1;
  uint uVar2;
  size_t sVar3;
  ulong uVar4;
  SystemInformation info;
  unsigned_long pc;
  string local_60;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  fakeProcessorCount;
  
  (this->ParallelLevel).super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_payload._M_value =
       level.super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long>._M_payload;
  (this->ParallelLevel).super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_engaged =
       level.super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long>._M_engaged;
  if (((undefined1  [16])
       level.super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long> & (undefined1  [16])0x1) == (undefined1  [16])0x0
     ) {
    cmsys::SystemInformation::SystemInformation(&info);
    cmsys::SystemInformation::RunCPUCheck(&info);
    uVar2 = cmsys::SystemInformation::GetNumberOfLogicalCPU(&info);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_60,"__CTEST_FAKE_PROCESSOR_COUNT_FOR_TESTING",(allocator<char> *)&pc
              );
    cmSystemTools::GetEnvVar(&fakeProcessorCount,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    uVar4 = (ulong)uVar2;
    if (fakeProcessorCount.
        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ._M_engaged == true) {
      pc = 0;
      bVar1 = cmStrToULong((string *)&fakeProcessorCount,&pc);
      uVar4 = pc;
      if (!bVar1) {
        std::operator+(&local_60,"Failed to parse fake processor count: ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &fakeProcessorCount);
        cmSystemTools::Error(&local_60);
        std::__cxx11::string::~string((string *)&local_60);
        uVar4 = (ulong)uVar2;
      }
    }
    std::
    _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&fakeProcessorCount);
    sVar3 = 2;
    if (2 < uVar4) {
      sVar3 = uVar4;
    }
    this->ParallelLevelDefault = sVar3;
    cmsys::SystemInformation::~SystemInformation(&info);
  }
  return;
}

Assistant:

void cmCTestMultiProcessHandler::SetParallelLevel(cm::optional<size_t> level)
{
  this->ParallelLevel = level;

  if (!this->ParallelLevel) {
    // '-j' was given with no value.  Limit by number of processors.
    cmsys::SystemInformation info;
    info.RunCPUCheck();
    unsigned long processorCount = info.GetNumberOfLogicalCPU();

    if (cm::optional<std::string> fakeProcessorCount =
          cmSystemTools::GetEnvVar(
            "__CTEST_FAKE_PROCESSOR_COUNT_FOR_TESTING")) {
      unsigned long pc = 0;
      if (cmStrToULong(*fakeProcessorCount, &pc)) {
        processorCount = pc;
      } else {
        cmSystemTools::Error("Failed to parse fake processor count: " +
                             *fakeProcessorCount);
      }
    }

    this->ParallelLevelDefault =
      std::max(kParallelLevelMinimum, processorCount);
  }
}